

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O3

RegExp * __thiscall re2c::Scanner::cls(Scanner *this,Range *r)

{
  type_t tVar1;
  empty_class_policy_t eVar2;
  opt_t *poVar3;
  RegExp *pRVar4;
  RegExp *local_18;
  
  if (r == (Range *)0x0) {
    poVar3 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
    eVar2 = poVar3->empty_class_policy;
    if (eVar2 == EMPTY_CLASS_ERROR) {
      fatal(this,0,"empty character class");
    }
    else if (eVar2 == EMPTY_CLASS_MATCH_NONE) {
      Warn::empty_class((Warn *)warn,
                        (&(this->super_ScannerState).tline)[(this->super_ScannerState).in_parse ^ 1]
                       );
    }
    else if (eVar2 == EMPTY_CLASS_MATCH_EMPTY) {
      Warn::empty_class((Warn *)warn,
                        (&(this->super_ScannerState).tline)[(this->super_ScannerState).in_parse ^ 1]
                       );
      pRVar4 = (RegExp *)operator_new(8);
      pRVar4->_vptr_RegExp = (_func_int **)&PTR__RegExp_0015bd10;
      local_18 = pRVar4;
      std::
      _Rb_tree<re2c::RegExp*,re2c::RegExp*,std::_Identity<re2c::RegExp*>,std::less<re2c::RegExp*>,std::allocator<re2c::RegExp*>>
      ::_M_insert_unique<re2c::RegExp*>
                ((_Rb_tree<re2c::RegExp*,re2c::RegExp*,std::_Identity<re2c::RegExp*>,std::less<re2c::RegExp*>,std::allocator<re2c::RegExp*>>
                  *)RegExp::vFreeList,&local_18);
      pRVar4->_vptr_RegExp = (_func_int **)&PTR__RegExp_0015bc50;
      return pRVar4;
    }
  }
  poVar3 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
  tVar1 = (poVar3->encoding).type_;
  if (tVar1 != UTF8) {
    if (tVar1 != UTF16) {
      pRVar4 = (RegExp *)operator_new(0x10);
      pRVar4->_vptr_RegExp = (_func_int **)&PTR__RegExp_0015bd10;
      local_18 = pRVar4;
      std::
      _Rb_tree<re2c::RegExp*,re2c::RegExp*,std::_Identity<re2c::RegExp*>,std::less<re2c::RegExp*>,std::allocator<re2c::RegExp*>>
      ::_M_insert_unique<re2c::RegExp*>
                ((_Rb_tree<re2c::RegExp*,re2c::RegExp*,std::_Identity<re2c::RegExp*>,std::less<re2c::RegExp*>,std::allocator<re2c::RegExp*>>
                  *)RegExp::vFreeList,&local_18);
      pRVar4->_vptr_RegExp = (_func_int **)&PTR__RegExp_0015bbf0;
      pRVar4[1]._vptr_RegExp = (_func_int **)r;
      return pRVar4;
    }
    pRVar4 = UTF16Range(r);
    return pRVar4;
  }
  pRVar4 = UTF8Range(r);
  return pRVar4;
}

Assistant:

RegExp *Scanner::cls(Range *r) const
{
	if (!r)
	{
		switch (opts->empty_class_policy)
		{
			case EMPTY_CLASS_MATCH_EMPTY:
				warn.empty_class (get_line ());
				return new NullOp;
			case EMPTY_CLASS_MATCH_NONE:
				warn.empty_class (get_line ());
				break;
			case EMPTY_CLASS_ERROR:
				fatal ("empty character class");
				break;
		}
	}

	switch (opts->encoding.type ())
	{
		case Enc::UTF16: return UTF16Range(r);
		case Enc::UTF8:  return UTF8Range(r);
		default:         return new MatchOp(r);
	}
}